

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O2

uint32_t pull_le32(uchar **cursor,size_t *max)

{
  leint32_t lev;
  
  pull_bytes(&lev,4,cursor,max);
  return lev;
}

Assistant:

uint32_t pull_le32(const unsigned char **cursor, size_t *max)
{
    leint32_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le32_to_cpu(lev);
}